

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::ArrayPtr<const_unsigned_char>_&> __thiscall
kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
find<0ul,kj::ArrayPtr<unsigned_char_const>&>
          (Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *this,
          ArrayPtr<const_unsigned_char> *params)

{
  uchar *puVar1;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table;
  char local_28;
  size_t local_20;
  
  table.ptr = params + 2;
  table.size_ = (size_t)params->ptr;
  HashIndex<kj::_::HashSetCallbacks>::
  find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&local_28,table,
             (ArrayPtr<const_unsigned_char> *)((long)(params->size_ - (long)params->ptr) >> 4));
  if (local_28 == '\x01') {
    puVar1 = params->ptr + local_20 * 0x10;
  }
  else {
    puVar1 = (uchar *)0x0;
  }
  *(uchar **)this = puVar1;
  return (Maybe<kj::ArrayPtr<const_unsigned_char>_&>)(ArrayPtr<const_unsigned_char> *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}